

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

bool_t ecpIsValid(ec_o *ec,void *stack)

{
  bool_t bVar1;
  int iVar2;
  word *in_RSI;
  word *in_RDI;
  word *t3;
  word *t2;
  word *t1;
  size_t n;
  size_t *stack_00;
  ec_o *ec_00;
  word *a;
  size_t *mod;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  a = *(word **)(in_RDI[3] + 0x30);
  ec_00 = (ec_o *)(in_RSI + (long)a);
  stack_00 = &(ec_00->hdr).keep + (long)a;
  mod = stack_00 + (long)a;
  bVar1 = ecIsOperable2(ec_00);
  if ((((bVar1 != 0) && (bVar1 = gfpIsValid((qr_o *)ec_00,stack_00), bVar1 != 0)) &&
      (iVar2 = wwCmpW(a,(size_t)in_RSI,(word)ec_00), 0 < iVar2)) &&
     (((*(ulong *)(in_RDI[3] + 0x88) <= in_RDI[0x15] &&
       (iVar2 = wwCmp((word *)in_RDI[4],*(word **)(in_RDI[3] + 0x18),*(size_t *)(in_RDI[3] + 0x30)),
       iVar2 < 0)) &&
      (iVar2 = wwCmp((word *)in_RDI[5],*(word **)(in_RDI[3] + 0x18),*(size_t *)(in_RDI[3] + 0x30)),
      iVar2 < 0)))) {
    (**(code **)(in_RDI[3] + 0x70))(in_RSI,in_RDI[4],in_RDI[3],mod);
    (**(code **)(in_RDI[3] + 0x68))(in_RSI,in_RSI,in_RDI[4],in_RDI[3],mod);
    zzDoubleMod(t3,(word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                (size_t)mod);
    zzDoubleMod(t3,(word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                (size_t)mod);
    (**(code **)(in_RDI[3] + 0x70))(ec_00,in_RDI[5],in_RDI[3],mod);
    zzDoubleMod(t3,(word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                (size_t)mod);
    zzAddMod(t3,(word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,mod,
             (size_t)a);
    zzDoubleMod(t3,(word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                (size_t)mod);
    zzAddMod(t3,(word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,mod,
             (size_t)a);
    zzDoubleMod(t3,(word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                (size_t)mod);
    zzAddMod(t3,(word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,mod,
             (size_t)a);
    zzAddMod(t3,(word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,mod,
             (size_t)a);
    bVar1 = wwIsZero(in_RSI,*(size_t *)(in_RDI[3] + 0x30));
    return (uint)((bVar1 != 0 ^ 0xffU) & 1);
  }
  return 0;
}

Assistant:

bool_t ecpIsValid(const ec_o* ec, void* stack)
{
	size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	word* t3 = t2 + n;
	stack = t3 + n;
	// кривая работоспособна?
	// поле ec->f корректно?
	// f->mod > 3?
	// ec->deep >= ec->f->deep?
	// A, B \in ec->f?
	if (!ecIsOperable2(ec) ||
		!gfpIsValid(ec->f, stack) ||
		wwCmpW(ec->f->mod, ec->f->n, 3) <= 0 ||
		ec->deep < ec->f->deep ||
		!zmIsIn(ec->A, ec->f) || 
		!zmIsIn(ec->B, ec->f))
		return FALSE;
	// t1 <- 4 A^3
	qrSqr(t1, ec->A, ec->f, stack);
	qrMul(t1, t1, ec->A, ec->f, stack);
	gfpDouble(t1, t1, ec->f);
	gfpDouble(t1, t1, ec->f);
	// t2 <- 27 B^2
	qrSqr(t2, ec->B, ec->f, stack);
	gfpDouble(t3, t2, ec->f);
	zmAdd(t2, t2, t3, ec->f);
	gfpDouble(t3, t2, ec->f);
	zmAdd(t2, t2, t3, ec->f);
	gfpDouble(t3, t2, ec->f);
	zmAdd(t2, t2, t3, ec->f);
	// t1 <- t1 + t2 [4 A^3 + 27 B^2 -- дискриминант]
	zmAdd(t1, t1, t2, ec->f);
	// t1 == 0 => сингулярная кривая
	return !qrIsZero(t1, ec->f);
}